

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O0

void __thiscall QDataWidgetMapperPrivate::QDataWidgetMapperPrivate(QDataWidgetMapperPrivate *this)

{
  undefined8 uVar1;
  QObjectPrivate *in_RDI;
  array<QMetaObject::Connection,_2UL> *unaff_retaddr;
  
  QObjectPrivate::QObjectPrivate(in_RDI,QObjectPrivateVersion);
  *(undefined ***)in_RDI = &PTR__QDataWidgetMapperPrivate_00d2e7b0;
  uVar1 = QAbstractItemModelPrivate::staticEmptyModel();
  *(undefined8 *)(in_RDI + 0x78) = uVar1;
  *(undefined8 *)(in_RDI + 0x80) = 0;
  *(undefined4 *)(in_RDI + 0x88) = 1;
  *(undefined4 *)(in_RDI + 0x8c) = 0;
  QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)(in_RDI + 0x90));
  QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)(in_RDI + 0x98));
  std::
  vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  ::vector((vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
            *)0x8725df);
  std::array<QMetaObject::Connection,_2UL>::array(unaff_retaddr);
  std::array<QMetaObject::Connection,_2UL>::array(unaff_retaddr);
  return;
}

Assistant:

QDataWidgetMapperPrivate()
        : model(QAbstractItemModelPrivate::staticEmptyModel()), delegate(nullptr),
          orientation(Qt::Horizontal), submitPolicy(QDataWidgetMapper::AutoSubmit)
    {
    }